

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O1

int mbedtls_ecp_group_load(mbedtls_ecp_group *grp,mbedtls_ecp_group_id id)

{
  mbedtls_mpi *X;
  int iVar1;
  size_t sVar2;
  mbedtls_mpi_uint *pmVar3;
  size_t sVar4;
  mbedtls_mpi_uint *pmVar5;
  size_t alen;
  mbedtls_mpi_uint *pmVar6;
  mbedtls_mpi_uint *pmVar7;
  mbedtls_mpi_uint *pmVar8;
  mbedtls_mpi_uint *gx;
  size_t blen;
  
  mbedtls_ecp_group_free(grp);
  grp->id = id;
  switch(id) {
  case MBEDTLS_ECP_DP_SECP192R1:
    grp->modp = ecp_mod_p192;
    sVar2 = 0x18;
    pmVar6 = secp192r1_n;
    pmVar7 = secp192r1_gy;
    pmVar8 = secp192r1_gx;
    pmVar3 = secp192r1_p;
    pmVar5 = secp192r1_b;
    sVar4 = 0x18;
    break;
  case MBEDTLS_ECP_DP_SECP224R1:
    grp->modp = ecp_mod_p224;
    pmVar6 = secp224r1_n;
    pmVar7 = secp224r1_gy;
    pmVar8 = secp224r1_gx;
    pmVar3 = secp224r1_p;
    pmVar5 = secp224r1_b;
    goto LAB_00126516;
  case MBEDTLS_ECP_DP_SECP256R1:
    grp->modp = ecp_mod_p256;
    pmVar6 = secp256r1_n;
    pmVar7 = secp256r1_gy;
    pmVar8 = secp256r1_gx;
    pmVar3 = secp256r1_p;
    pmVar5 = secp256r1_b;
LAB_00126516:
    sVar2 = 0x20;
    sVar4 = 0x20;
    break;
  case MBEDTLS_ECP_DP_SECP384R1:
    grp->modp = ecp_mod_p384;
    sVar2 = 0x30;
    pmVar6 = secp384r1_n;
    pmVar7 = secp384r1_gy;
    pmVar8 = secp384r1_gx;
    pmVar3 = secp384r1_p;
    pmVar5 = secp384r1_b;
    sVar4 = 0x30;
    break;
  case MBEDTLS_ECP_DP_SECP521R1:
    grp->modp = ecp_mod_p521;
    sVar2 = 0x48;
    pmVar6 = secp521r1_n;
    pmVar7 = secp521r1_gy;
    pmVar8 = secp521r1_gx;
    pmVar3 = secp521r1_p;
    pmVar5 = secp521r1_b;
    sVar4 = 0x48;
    break;
  case MBEDTLS_ECP_DP_BP256R1:
    blen = 0x20;
    pmVar7 = brainpoolP256r1_n;
    pmVar8 = brainpoolP256r1_gy;
    gx = brainpoolP256r1_gx;
    pmVar5 = brainpoolP256r1_p;
    pmVar3 = brainpoolP256r1_a;
    pmVar6 = brainpoolP256r1_b;
    sVar4 = 0x20;
    alen = 0x20;
    sVar2 = blen;
    goto LAB_00126625;
  case MBEDTLS_ECP_DP_BP384R1:
    blen = 0x30;
    pmVar7 = brainpoolP384r1_n;
    pmVar8 = brainpoolP384r1_gy;
    gx = brainpoolP384r1_gx;
    pmVar5 = brainpoolP384r1_p;
    pmVar3 = brainpoolP384r1_a;
    pmVar6 = brainpoolP384r1_b;
    sVar4 = 0x30;
    alen = 0x30;
    sVar2 = blen;
    goto LAB_00126625;
  case MBEDTLS_ECP_DP_BP512R1:
    blen = 0x40;
    pmVar7 = brainpoolP512r1_n;
    pmVar8 = brainpoolP512r1_gy;
    gx = brainpoolP512r1_gx;
    pmVar5 = brainpoolP512r1_p;
    pmVar3 = brainpoolP512r1_a;
    pmVar6 = brainpoolP512r1_b;
    sVar4 = 0x40;
    alen = 0x40;
    sVar2 = blen;
    goto LAB_00126625;
  case MBEDTLS_ECP_DP_CURVE25519:
    grp->modp = ecp_mod_p255;
    iVar1 = mbedtls_mpi_read_string(&grp->A,0x10,"01DB42");
    if (iVar1 == 0) {
      X = &grp->P;
      iVar1 = mbedtls_mpi_lset(X,1);
      if (((iVar1 == 0) && (iVar1 = mbedtls_mpi_shift_l(X,0xff), iVar1 == 0)) &&
         (iVar1 = mbedtls_mpi_sub_int(X,X,0x13), iVar1 == 0)) {
        sVar2 = mbedtls_mpi_bitlen(X);
        grp->pbits = sVar2;
        iVar1 = mbedtls_mpi_lset(&(grp->G).X,9);
        if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_lset(&(grp->G).Z,1), iVar1 == 0)) {
          mbedtls_mpi_free(&(grp->G).Y);
          grp->nbits = 0xfe;
          iVar1 = 0;
        }
      }
    }
    if (iVar1 == 0) {
      return 0;
    }
    mbedtls_ecp_group_free(grp);
    return iVar1;
  case MBEDTLS_ECP_DP_SECP192K1:
    grp->modp = ecp_mod_p192k1;
    sVar2 = 0x18;
    pmVar7 = secp192k1_n;
    pmVar8 = secp192k1_gy;
    gx = secp192k1_gx;
    pmVar5 = secp192k1_p;
    pmVar3 = secp192k1_a;
    pmVar6 = secp192k1_b;
    sVar4 = 0x18;
    goto LAB_00126611;
  case MBEDTLS_ECP_DP_SECP224K1:
    grp->modp = ecp_mod_p224k1;
    pmVar7 = secp224k1_n;
    pmVar8 = secp224k1_gy;
    gx = secp224k1_gx;
    pmVar5 = secp224k1_p;
    pmVar3 = secp224k1_a;
    pmVar6 = secp224k1_b;
    goto LAB_0012660c;
  case MBEDTLS_ECP_DP_SECP256K1:
    grp->modp = ecp_mod_p256k1;
    pmVar7 = secp256k1_n;
    pmVar8 = secp256k1_gy;
    gx = secp256k1_gx;
    pmVar5 = secp256k1_p;
    pmVar3 = secp256k1_a;
    pmVar6 = secp256k1_b;
LAB_0012660c:
    sVar2 = 0x20;
    sVar4 = 0x20;
LAB_00126611:
    alen = 8;
    blen = 8;
LAB_00126625:
    ecp_group_load(grp,pmVar5,sVar4,pmVar3,alen,pmVar6,blen,gx,sVar2,pmVar8,sVar2,pmVar7,sVar2);
    return 0;
  default:
    mbedtls_ecp_group_free(grp);
    return -0x4e80;
  }
  ecp_group_load(grp,pmVar3,sVar4,(mbedtls_mpi_uint *)0x0,0,pmVar5,sVar2,pmVar8,sVar2,pmVar7,sVar2,
                 pmVar6,sVar2);
  return 0;
}

Assistant:

int mbedtls_ecp_group_load( mbedtls_ecp_group *grp, mbedtls_ecp_group_id id )
{
    mbedtls_ecp_group_free( grp );

    grp->id = id;

    switch( id )
    {
#if defined(MBEDTLS_ECP_DP_SECP192R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP192R1:
            NIST_MODP( p192 );
            return( LOAD_GROUP( secp192r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP192R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP224R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP224R1:
            NIST_MODP( p224 );
            return( LOAD_GROUP( secp224r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP224R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP256R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP256R1:
            NIST_MODP( p256 );
            return( LOAD_GROUP( secp256r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP256R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP384R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP384R1:
            NIST_MODP( p384 );
            return( LOAD_GROUP( secp384r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP384R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP521R1_ENABLED)
        case MBEDTLS_ECP_DP_SECP521R1:
            NIST_MODP( p521 );
            return( LOAD_GROUP( secp521r1 ) );
#endif /* MBEDTLS_ECP_DP_SECP521R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP192K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP192K1:
            grp->modp = ecp_mod_p192k1;
            return( LOAD_GROUP_A( secp192k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP192K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP224K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP224K1:
            grp->modp = ecp_mod_p224k1;
            return( LOAD_GROUP_A( secp224k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP224K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_SECP256K1_ENABLED)
        case MBEDTLS_ECP_DP_SECP256K1:
            grp->modp = ecp_mod_p256k1;
            return( LOAD_GROUP_A( secp256k1 ) );
#endif /* MBEDTLS_ECP_DP_SECP256K1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP256R1_ENABLED)
        case MBEDTLS_ECP_DP_BP256R1:
            return( LOAD_GROUP_A( brainpoolP256r1 ) );
#endif /* MBEDTLS_ECP_DP_BP256R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP384R1_ENABLED)
        case MBEDTLS_ECP_DP_BP384R1:
            return( LOAD_GROUP_A( brainpoolP384r1 ) );
#endif /* MBEDTLS_ECP_DP_BP384R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_BP512R1_ENABLED)
        case MBEDTLS_ECP_DP_BP512R1:
            return( LOAD_GROUP_A( brainpoolP512r1 ) );
#endif /* MBEDTLS_ECP_DP_BP512R1_ENABLED */

#if defined(MBEDTLS_ECP_DP_CURVE25519_ENABLED)
        case MBEDTLS_ECP_DP_CURVE25519:
            grp->modp = ecp_mod_p255;
            return( ecp_use_curve25519( grp ) );
#endif /* MBEDTLS_ECP_DP_CURVE25519_ENABLED */

        default:
            mbedtls_ecp_group_free( grp );
            return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );
    }
}